

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# form.cpp
# Opt level: O3

void __thiscall cppcms::widgets::base_text::~base_text(base_text *this,void **vtt)

{
  _func_int **pp_Var1;
  _data *p_Var2;
  pointer pcVar3;
  
  pp_Var1 = (_func_int **)*vtt;
  this->_vptr_base_text = pp_Var1;
  *(void **)((long)&this->_vptr_base_text + (long)pp_Var1[-3]) = vtt[1];
  p_Var2 = (this->d).ptr_;
  if (p_Var2 != (_data *)0x0) {
    operator_delete(p_Var2);
  }
  pcVar3 = (this->value_)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != &(this->value_).field_2) {
    operator_delete(pcVar3);
    return;
  }
  return;
}

Assistant:

base_text::~base_text()
{
}